

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimatedPerspectiveCamera(XMLLoader *this,Ref<embree::XML> *xml)

{
  size_t sVar1;
  reference pvVar2;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *this_00;
  Node *in_RDI;
  Vec2f time_range;
  size_t i;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  cameras;
  size_t numCameras;
  allocator_type *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  allocator *paVar3;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe08;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *in_stack_fffffffffffffe10;
  AnimatedPerspectiveCameraNode *in_stack_fffffffffffffe18;
  BBox1f in_stack_fffffffffffffe20;
  PerspectiveCameraNode *local_1c8;
  allocator local_179;
  string local_178 [40];
  string *in_stack_fffffffffffffeb0;
  XML *in_stack_fffffffffffffeb8;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  local_120;
  ulong local_108;
  Ref<embree::XML> *in_stack_ffffffffffffff20;
  XMLLoader *in_stack_ffffffffffffff28;
  
  sVar1 = XML::size((XML *)0x38cb12);
  if (sVar1 == 0) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
  }
  else {
    std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>::allocator
              ((allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_> *)0x38cb9d);
    std::
    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ::vector(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>::~allocator
              ((allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_> *)0x38cbc9);
    for (local_108 = 0; local_108 < sVar1; local_108 = local_108 + 1) {
      XML::child(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
      loadPerspectiveCamera(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if (local_120.
          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        local_1c8 = (PerspectiveCameraNode *)0x0;
      }
      else {
        local_1c8 = (PerspectiveCameraNode *)
                    __dynamic_cast(local_120.
                                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   &SceneGraph::Node::typeinfo,
                                   &SceneGraph::PerspectiveCameraNode::typeinfo,0);
      }
      local_120.
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8;
      if (local_1c8 != (PerspectiveCameraNode *)0x0) {
        (*(local_1c8->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      pvVar2 = std::
               vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                             *)&stack0xffffffffffffff18,local_108);
      if (pvVar2->ptr != (PerspectiveCameraNode *)0x0) {
        (*(pvVar2->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pvVar2->ptr = (PerspectiveCameraNode *)
                    local_120.
                    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      in_stack_fffffffffffffe20 =
           (BBox1f)&local_120.
                    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_120.
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      in_stack_fffffffffffffe18 =
           (AnimatedPerspectiveCameraNode *)
           &local_120.
            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (local_120.
          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        (*(code *)((local_120.
                    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->ptr->super_Node).fileName.
                  _M_string_length)();
      }
      in_stack_fffffffffffffe10 = &local_120;
      if (local_120.
          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)((local_120.
                    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).fileName.
                  _M_string_length)();
      }
    }
    paVar3 = (allocator *)&stack0xfffffffffffffeb7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffeb8,"time_range",paVar3);
    XML::parm_Vec2f(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
    this_00 = (vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               *)SceneGraph::PerspectiveCameraNode::operator_new(0x38d02c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"",&local_179);
    SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe08);
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::
    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ::~vector(this_00);
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimatedPerspectiveCamera(const Ref<XML>& xml) 
  {
    size_t numCameras = xml->size();
    if (numCameras == 0)
      return nullptr;
    
    std::vector<Ref<SceneGraph::PerspectiveCameraNode>> cameras(numCameras);
    
    for (size_t i=0; i<numCameras; i++) 
      cameras[i] = loadPerspectiveCamera(xml->child(i)).dynamicCast<SceneGraph::PerspectiveCameraNode>();

    const Vec2f time_range = xml->parm_Vec2f("time_range");
    return new SceneGraph::AnimatedPerspectiveCameraNode(std::move(cameras),BBox1f(time_range.x,time_range.y));
  }